

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O0

void I_ShutdownGraphics(void)

{
  DFrameBuffer *pDVar1;
  DFrameBuffer *s;
  
  pDVar1 = screen;
  if (screen != (DFrameBuffer *)0x0) {
    screen = (DFrameBuffer *)0x0;
    (pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags =
         (pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject.ObjectFlags | 0x80;
    if (pDVar1 != (DFrameBuffer *)0x0) {
      (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[2])();
    }
  }
  if (Video != (IVideo *)0x0) {
    if (Video != (IVideo *)0x0) {
      (*Video->_vptr_IVideo[1])();
    }
    Video = (IVideo *)0x0;
  }
  SDL_QuitSubSystem(0x20);
  return;
}

Assistant:

void I_ShutdownGraphics ()
{
	if (screen)
	{
		DFrameBuffer *s = screen;
		screen = NULL;
		s->ObjectFlags |= OF_YesReallyDelete;
		delete s;
	}
	if (Video)
		delete Video, Video = NULL;

	SDL_QuitSubSystem (SDL_INIT_VIDEO);
}